

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

bool __thiscall
Lowerer::TryGenerateFastBrSrXx
          (Lowerer *this,Instr *instr,RegOpnd *srcReg1,RegOpnd *srcReg2,Instr **pInstrPrev,
          bool noMathFastPath)

{
  bool bVar1;
  bool bVar2;
  BranchInstr *branchInstr;
  Opnd *constOpnd;
  Lowerer *this_00;
  
  this_00 = (Lowerer *)instr;
  bVar1 = IR::Instr::IsNeq(instr);
  if (srcReg2 == (RegOpnd *)0x0) {
LAB_0056346a:
    if (srcReg1 != (RegOpnd *)0x0) {
      bVar2 = IsConstRegOpnd(this_00,srcReg1);
      if (bVar2) {
        IR::Instr::SwapOpnds(instr);
        srcReg2 = srcReg1;
        goto LAB_00563486;
      }
    }
    bVar1 = false;
  }
  else {
    bVar2 = IsConstRegOpnd(this_00,srcReg2);
    if (!bVar2) goto LAB_0056346a;
LAB_00563486:
    branchInstr = IR::Instr::AsBranchInstr(instr);
    constOpnd = GetConstRegOpnd(this,srcReg2,instr);
    GenerateFastBrConst(this,branchInstr,constOpnd,!bVar1);
    IR::Instr::Remove(instr);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool
Lowerer::TryGenerateFastBrSrXx(IR::Instr * instr, IR::RegOpnd * srcReg1, IR::RegOpnd * srcReg2, IR::Instr ** pInstrPrev, bool noMathFastPath)
{
    bool isEqual = !instr->IsNeq();

    if (srcReg2 && IsConstRegOpnd(srcReg2))
    {
        this->GenerateFastBrConst(instr->AsBranchInstr(), GetConstRegOpnd(srcReg2, instr), isEqual);
        instr->Remove();
        return true;
    }
    else if (srcReg1 && IsConstRegOpnd(srcReg1))
    {
        instr->SwapOpnds();
        this->GenerateFastBrConst(instr->AsBranchInstr(), GetConstRegOpnd(srcReg1, instr), isEqual);
        instr->Remove();
        return true;
    }

    return false;
}